

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall re2::CharClassBuilder::Negate(CharClassBuilder *this)

{
  int l;
  bool bVar1;
  size_type sVar2;
  pointer pRVar3;
  size_type sVar4;
  reference __x;
  ulong local_78;
  size_t i;
  RuneRange local_68;
  _Self local_60;
  int local_54;
  int nextlo;
  _Self local_48;
  _Self local_40;
  iterator it;
  undefined1 local_28 [8];
  vector<re2::RuneRange,_std::allocator<re2::RuneRange>_> v;
  CharClassBuilder *this_local;
  
  v.super__Vector_base<re2::RuneRange,_std::allocator<re2::RuneRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<re2::RuneRange,_std::allocator<re2::RuneRange>_>::vector
            ((vector<re2::RuneRange,_std::allocator<re2::RuneRange>_> *)local_28);
  sVar2 = std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::size
                    (&this->ranges_);
  std::vector<re2::RuneRange,_std::allocator<re2::RuneRange>_>::reserve
            ((vector<re2::RuneRange,_std::allocator<re2::RuneRange>_> *)local_28,sVar2 + 1);
  local_40._M_node = (_Base_ptr)begin(this);
  local_48._M_node = (_Base_ptr)end(this);
  bVar1 = std::operator==(&local_40,&local_48);
  if (bVar1) {
    RuneRange::RuneRange((RuneRange *)&stack0xffffffffffffffb0,0,0x10ffff);
    std::vector<re2::RuneRange,_std::allocator<re2::RuneRange>_>::push_back
              ((vector<re2::RuneRange,_std::allocator<re2::RuneRange>_> *)local_28,
               (value_type *)&stack0xffffffffffffffb0);
  }
  else {
    local_54 = 0;
    pRVar3 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_40);
    if (pRVar3->lo == 0) {
      pRVar3 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_40);
      local_54 = pRVar3->hi + 1;
      std::_Rb_tree_const_iterator<re2::RuneRange>::operator++(&local_40);
    }
    while( true ) {
      local_60._M_node = (_Base_ptr)end(this);
      bVar1 = std::operator!=(&local_40,&local_60);
      l = local_54;
      if (!bVar1) break;
      pRVar3 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_40);
      RuneRange::RuneRange(&local_68,l,pRVar3->lo + -1);
      std::vector<re2::RuneRange,_std::allocator<re2::RuneRange>_>::push_back
                ((vector<re2::RuneRange,_std::allocator<re2::RuneRange>_> *)local_28,&local_68);
      pRVar3 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_40);
      local_54 = pRVar3->hi + 1;
      std::_Rb_tree_const_iterator<re2::RuneRange>::operator++(&local_40);
    }
    if (local_54 < 0x110000) {
      RuneRange::RuneRange((RuneRange *)&i,local_54,0x10ffff);
      std::vector<re2::RuneRange,_std::allocator<re2::RuneRange>_>::push_back
                ((vector<re2::RuneRange,_std::allocator<re2::RuneRange>_> *)local_28,
                 (value_type *)&i);
    }
  }
  std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::clear
            (&this->ranges_);
  for (local_78 = 0;
      sVar4 = std::vector<re2::RuneRange,_std::allocator<re2::RuneRange>_>::size
                        ((vector<re2::RuneRange,_std::allocator<re2::RuneRange>_> *)local_28),
      local_78 < sVar4; local_78 = local_78 + 1) {
    __x = std::vector<re2::RuneRange,_std::allocator<re2::RuneRange>_>::operator[]
                    ((vector<re2::RuneRange,_std::allocator<re2::RuneRange>_> *)local_28,local_78);
    std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::insert
              (&this->ranges_,__x);
  }
  this->upper_ = (this->upper_ ^ 0xffffffff) & 0x3ffffff;
  this->lower_ = (this->lower_ ^ 0xffffffff) & 0x3ffffff;
  this->nrunes_ = 0x110000 - this->nrunes_;
  std::vector<re2::RuneRange,_std::allocator<re2::RuneRange>_>::~vector
            ((vector<re2::RuneRange,_std::allocator<re2::RuneRange>_> *)local_28);
  return;
}

Assistant:

void CharClassBuilder::Negate() {
  // Build up negation and then copy in.
  // Could edit ranges in place, but C++ won't let me.
  vector<RuneRange> v;
  v.reserve(ranges_.size() + 1);

  // In negation, first range begins at 0, unless
  // the current class begins at 0.
  iterator it = begin();
  if (it == end()) {
    v.push_back(RuneRange(0, Runemax));
  } else {
    int nextlo = 0;
    if (it->lo == 0) {
      nextlo = it->hi + 1;
      ++it;
    }
    for (; it != end(); ++it) {
      v.push_back(RuneRange(nextlo, it->lo - 1));
      nextlo = it->hi + 1;
    }
    if (nextlo <= Runemax)
      v.push_back(RuneRange(nextlo, Runemax));
  }

  ranges_.clear();
  for (size_t i = 0; i < v.size(); i++)
    ranges_.insert(v[i]);

  upper_ = AlphaMask & ~upper_;
  lower_ = AlphaMask & ~lower_;
  nrunes_ = Runemax+1 - nrunes_;
}